

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O3

void __thiscall Population::evolve(Population *this)

{
  int iVar1;
  double dVar2;
  int iVar3;
  DNA *dna;
  DNA *dna1;
  DNA *dna2;
  pointer pDVar4;
  long lVar5;
  pointer pDVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  vector<DNA,_std::allocator<DNA>_> new_population;
  DNA newDNA;
  double local_b0;
  vector<DNA,_std::allocator<DNA>_> local_a8;
  vector<int,_std::allocator<int>_> *local_88;
  DNA local_80;
  DNA local_58;
  
  local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pDVar4 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar6 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar6 == pDVar4) {
    local_b0 = 0.0;
    local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = 0;
    local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_start.
    _4_4_ = 0;
    local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_finish
    ._0_4_ = 0;
    local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_finish
    ._4_4_ = 0;
  }
  else {
    local_88 = &this->answer;
    uVar11 = 0;
    local_b0 = 0.0;
    do {
      random_engine();
      dVar2 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&random_engine::smt);
      dna1 = GetDNAWithProbability(this,dVar2 + 0.0);
      random_engine();
      dVar2 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&random_engine::smt);
      dna2 = GetDNAWithProbability(this,dVar2 + 0.0);
      crossover(&local_58,this,dna1,dna2);
      mutation(&local_80,this,&local_58);
      if (local_58.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((long)local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        iVar8 = 0;
      }
      else {
        lVar5 = (long)local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        lVar9 = 0;
        iVar8 = 0;
        do {
          iVar8 = iVar8 + (this->diophantine_).coeffs.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar9] *
                          local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar9);
      }
      iVar1 = (this->diophantine_).result;
      iVar3 = iVar8 - iVar1;
      iVar10 = -iVar3;
      if (0 < iVar3) {
        iVar10 = iVar3;
      }
      local_80.fitness = iVar10;
      if (iVar8 == iVar1) {
        this->answerReady = true;
        std::vector<int,_std::allocator<int>_>::operator=(local_88,&local_80.genes);
      }
      else {
        std::vector<DNA,_std::allocator<DNA>_>::push_back(&local_a8,&local_80);
        local_b0 = local_b0 + 1.0 / (double)iVar10;
      }
      if (local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pDVar4 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
               super__Vector_impl_data._M_start;
      pDVar6 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while ((iVar8 != iVar1) &&
            (uVar11 = uVar11 + 1, uVar7 = ((long)pDVar6 - (long)pDVar4 >> 3) * -0x3333333333333333,
            uVar11 <= uVar7 && uVar7 - uVar11 != 0));
  }
  local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  *(undefined4 *)
   &(this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
    super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  *(undefined4 *)
   ((long)&(this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_start + 4) =
       local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  *(undefined4 *)
   &(this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
    super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  *(undefined4 *)
   ((long)&(this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) =
       local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_a8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)pDVar4;
  local_80.genes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pDVar6;
  std::vector<DNA,_std::allocator<DNA>_>::~vector((vector<DNA,_std::allocator<DNA>_> *)&local_80);
  pDVar6 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pDVar4 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
                super__Vector_impl_data._M_start; pDVar4 != pDVar6; pDVar4 = pDVar4 + 1) {
    pDVar4->likelihood = (1.0 / (double)pDVar4->fitness) / local_b0;
  }
  std::vector<DNA,_std::allocator<DNA>_>::~vector(&local_a8);
  return;
}

Assistant:

void Population::evolve() {
    vector<DNA> new_population;
    double invSum = 0.0f;
    uniform_real_distribution<double> real_distribution(0.0, 1.0);

    for (int i = 0; i < population_.size(); ++i) {

        const DNA& dna1 = GetDNAWithProbability(real_distribution(random_engine()));
        const DNA& dna2 = GetDNAWithProbability(real_distribution(random_engine()));
        DNA newDNA = mutation(crossover(dna1, dna2));
        int fitness = newDNA.calcFitness(diophantine_);
        if (fitness == 0) {
            answerReady = true;
            answer = newDNA.genes;
            break;
        }
        invSum += 1.0 / static_cast<double>(fitness);
        new_population.push_back(newDNA);
    }

    population_ = move(new_population);
    for (DNA& dna : population_) {
        dna.likelihood = (1.0 / static_cast<double>(dna.fitness)) / invSum;
    }
}